

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clone_example_universe.h
# Opt level: O0

void CloneUniverse(Example *in,Example *out)

{
  Example *pEVar1;
  size_t sVar2;
  S_Object *pSVar3;
  ulong local_98;
  size_t i;
  CD_Scene local_80 [104];
  Example *local_18;
  Example *out_local;
  Example *in_local;
  
  local_18 = out;
  out_local = in;
  Example::initializeUniverse(out);
  sch::CD_Scene::CD_Scene(local_80);
  sch::CD_Scene::operator=(&local_18->sObj,local_80);
  sch::CD_Scene::~CD_Scene(local_80);
  local_98 = 0;
  while( true ) {
    sVar2 = sch::CD_Scene::size(&out_local->sObj);
    pEVar1 = local_18;
    if (sVar2 <= local_98) break;
    pSVar3 = sch::CD_Scene::operator[](&out_local->sObj,local_98);
    (**(code **)(*(long *)pSVar3 + 8))();
    sch::CD_Scene::addObject((S_Object *)pEVar1);
    local_98 = local_98 + 1;
  }
  return;
}

Assistant:

inline void CloneUniverse(Example & in, Example & out)
{
  // Initialize the universe to have the correct names
  out.initializeUniverse();
  // Clear the scene
  out.sObj = sch::CD_Scene();
  for(size_t i = 0; i < in.sObj.size(); ++i)
  {
    out.sObj.addObject(in.sObj[i]->clone());
  }
}